

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_rawsetp(lua_State *L,int idx,void *p)

{
  int iVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  StkId pTVar5;
  TValue *io;
  TValue k;
  Value local_28;
  undefined4 local_20;
  
  pTVar3 = index2addr(L,idx);
  local_20 = 2;
  local_28.p = p;
  pTVar4 = luaH_set(L,(Table *)(pTVar3->value_).gc,(TValue *)&local_28);
  pTVar5 = L->top;
  iVar1 = pTVar5[-1].tt_;
  uVar2 = *(undefined4 *)&pTVar5[-1].field_0xc;
  pTVar4->value_ = pTVar5[-1].value_;
  pTVar4->tt_ = iVar1;
  *(undefined4 *)&pTVar4->field_0xc = uVar2;
  pTVar5 = L->top;
  if ((((pTVar5[-1].tt_ & 0x40) != 0) && ((((Table *)(pTVar3->value_).gc)->marked & 4) != 0)) &&
     (((pTVar5[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar3->value_).gc);
    pTVar5 = L->top;
  }
  L->top = pTVar5 + -1;
  return;
}

Assistant:

LUA_API void lua_rawsetp(lua_State *L, int idx, const void *p) {
    StkId o;
    TValue k, *slot;
    lua_lock(L);
    api_checknelems(L, 1);
    o = index2addr(L, idx);
    api_check(L, ttistable(o), "table expected");
    setpvalue(&k, cast(
            void *, p));
    slot = luaH_set(L, hvalue(o), &k);
    setobj2t(L, slot, L->top - 1);
    luaC_barrierback(L, hvalue(o), L->top - 1);
    L->top--;
    lua_unlock(L);
}